

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDBusListener::ChangeSignal>::moveAppend
          (QGenericArrayOps<QDBusListener::ChangeSignal> *this,ChangeSignal *b,ChangeSignal *e)

{
  qsizetype *pqVar1;
  ChangeSignal *pCVar2;
  
  if (b != e) {
    pCVar2 = (this->super_QArrayDataPointer<QDBusListener::ChangeSignal>).ptr;
    for (; b < e; b = b + 1) {
      pCVar2[(this->super_QArrayDataPointer<QDBusListener::ChangeSignal>).size] = *b;
      pqVar1 = &(this->super_QArrayDataPointer<QDBusListener::ChangeSignal>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }